

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O0

bool __thiscall
GdlGlyphClassDefn::CheckRecursiveGlyphClasses
          (GdlGlyphClassDefn *this,
          vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *vpglfcStack)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  size_type_conflict sVar4;
  reference ppGVar5;
  reference ppGVar6;
  vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *in_RSI;
  value_type in_RDI;
  GdlGlyphClassMember *pglfd;
  iterator __end1;
  iterator __begin1;
  vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_> *__range1;
  size_t iglfd;
  GdlGlyphClassDefn *in_stack_ffffffffffffff38;
  vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *in_stack_ffffffffffffff40;
  string local_a0 [16];
  string *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  GdlObject *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff8c;
  GrcErrorList *in_stack_ffffffffffffff90;
  string local_68 [32];
  GdlGlyphClassMember *local_48;
  GdlGlyphClassMember **local_40;
  __normal_iterator<GdlGlyphClassMember_**,_std::vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>_>
  local_38;
  vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_> *local_30;
  ulong local_20;
  vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *local_18;
  
  local_20 = 0;
  local_18 = in_RSI;
  while( true ) {
    uVar1 = local_20;
    sVar4 = std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::size(local_18);
    if (sVar4 <= uVar1) {
      std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::push_back
                (in_stack_ffffffffffffff40,(value_type *)in_stack_ffffffffffffff38);
      local_30 = &in_RDI->m_vpglfdMembers;
      local_38._M_current =
           (GdlGlyphClassMember **)
           std::vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>::begin
                     ((vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_> *)
                      in_stack_ffffffffffffff38);
      local_40 = (GdlGlyphClassMember **)
                 std::vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>::end
                           ((vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_> *
                            )in_stack_ffffffffffffff38);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<GdlGlyphClassMember_**,_std::vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>_>
                            *)in_stack_ffffffffffffff40,
                           (__normal_iterator<GdlGlyphClassMember_**,_std::vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>_>
                            *)in_stack_ffffffffffffff38);
        if (!bVar2) {
          std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::pop_back
                    ((vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *)0x13909b);
          return true;
        }
        ppGVar6 = __gnu_cxx::
                  __normal_iterator<GdlGlyphClassMember_**,_std::vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>_>
                  ::operator*(&local_38);
        local_48 = *ppGVar6;
        uVar3 = (*(local_48->super_GdlDefn)._vptr_GdlDefn[2])(local_48,local_18);
        if ((uVar3 & 1) == 0) break;
        __gnu_cxx::
        __normal_iterator<GdlGlyphClassMember_**,_std::vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>_>
        ::operator++(&local_38);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_68,"Recursive class definition: ",(allocator *)&stack0xffffffffffffff97);
      Name_abi_cxx11_(in_stack_ffffffffffffff38);
      GrcErrorList::AddError
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
      return false;
    }
    ppGVar5 = std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::operator[]
                        (local_18,local_20);
    if (*ppGVar5 == in_RDI) break;
    local_20 = local_20 + 1;
  }
  return false;
}

Assistant:

bool GdlGlyphClassDefn::CheckRecursiveGlyphClasses(std::vector<GdlGlyphClassDefn*> & vpglfcStack)
{
	for (size_t iglfd = 0; iglfd < vpglfcStack.size(); iglfd++)
	{
		if (vpglfcStack[iglfd] == this)
			return false;
	}

	vpglfcStack.push_back(this);
	for (auto const pglfd: m_vpglfdMembers)
	{
		if (!pglfd->CheckRecursiveGlyphClasses(vpglfcStack))
		{
			g_errorList.AddError(4148, this, "Recursive class definition: ", this->Name());
			return false;
		}
	}
	vpglfcStack.pop_back();

	return true;
}